

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::MultiThreadRenderCase::executeForContexts
          (MultiThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  deInt32 *pdVar1;
  int *piVar2;
  Functions *gl;
  ostringstream *poVar3;
  deThreadPriority dVar4;
  SharedPtrStateBase *pSVar5;
  pointer pDVar6;
  long *plVar7;
  pointer ppVar8;
  _func_int **pp_Var9;
  _func_int **pp_Var10;
  TextureFormat TVar11;
  TextureFormat TVar12;
  pointer pSVar13;
  pointer pvVar14;
  pointer pSVar15;
  bool bVar16;
  EGLint EVar17;
  EGLint height;
  EGLint depthBits;
  EGLint stencilBits;
  EGLint EVar18;
  deUint32 dVar19;
  Library *egl;
  pointer pDVar20;
  Semaphore *this_00;
  SharedPtrStateBase *pSVar21;
  Program *pPVar22;
  long *plVar23;
  Thread *this_01;
  allocator_type *__a;
  Vec4 *color;
  size_type __n;
  pointer drawOp;
  int iVar24;
  long lVar25;
  uint uVar26;
  size_t __n_00;
  void *data;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *this_02;
  pointer pSVar30;
  float depth;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  drawOps;
  PixelFormat pixelFmt;
  vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> semaphores;
  Surface refFrame;
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  threads;
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  packets;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Surface frame;
  Random rnd;
  ulong local_2f0;
  long local_2e0;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  local_2a8;
  TextureFormat local_290;
  ulong local_288;
  int local_27c;
  PixelFormat local_278;
  vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_> local_268;
  Surface local_250;
  ulong local_238;
  ulong local_230;
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  local_228;
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  local_210;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  local_1f8;
  TextureFormat local_1e0;
  Surface local_1d8;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  egl = EglTestContext::getLibrary
                  ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  EVar17 = eglu::querySurfaceInt(egl,display,surface,0x3057);
  height = eglu::querySurfaceInt(egl,display,surface,0x3056);
  uVar28 = (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  local_278 = anon_unknown_4::getPixelFormat(egl,display,config->config);
  depthBits = eglu::getConfigAttribInt(egl,display,config->config,0x3025);
  stencilBits = eglu::getConfigAttribInt(egl,display,config->config,0x3026);
  EVar18 = eglu::getConfigAttribInt(egl,display,config->config,0x3031);
  local_290 = (TextureFormat)
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&local_250,EVar17,height);
  tcu::Surface::Surface(&local_1d8,EVar17,height);
  dVar19 = deStringHash((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase
                        .super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar27 = (uint)(uVar28 >> 4);
  uVar26 = ((uint)(uVar28 >> 0x14) & 0xffff ^ uVar27 ^ 0x3d) * 9;
  uVar26 = (uVar26 >> 4 ^ uVar26) * 0x27d4eb2d;
  deRandom_init(&local_1c0,uVar26 >> 0xf ^ dVar19 ^ uVar26);
  __n = (size_type)(int)uVar27;
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector(&local_1f8,__n,__a);
  local_288 = CONCAT44(local_288._4_4_,uVar27 * 2);
  __n_00 = (size_t)(int)(uVar27 * 2 | 1);
  std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::vector
            (&local_268,__n_00,(allocator_type *)local_1b0);
  iVar24 = uVar27 * 4;
  if (iVar24 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  this_02 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             *)(long)iVar24;
  local_2a8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar20 = std::
            _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            ::_M_allocate(this_02,__n_00);
  local_2a8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar20 + (long)this_02;
  local_2a8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar20;
  if (iVar24 != 0) {
    local_2a8.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar20;
    memset(pDVar20,0,(long)this_02 * 0x48);
    pDVar20 = pDVar20 + (long)this_02;
  }
  TVar11 = local_290;
  local_2a8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar20;
  std::
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  ::vector(&local_210,__n,(allocator_type *)local_1b0);
  std::
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  ::vector(&local_228,__n,(allocator_type *)local_1b0);
  TVar12 = local_290;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_290.order = TVar11.order;
  local_290.type = TVar11.type;
  local_1b0._0_4_ = local_290.order;
  local_1b0._4_4_ = local_290.type;
  local_290 = TVar12;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"EGL_RED_SIZE = ",0xf);
  std::ostream::operator<<(poVar3,local_278.redBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  TVar12 = local_290;
  local_290.order = TVar11.order;
  local_290.type = TVar11.type;
  local_1b0._0_4_ = local_290.order;
  local_1b0._4_4_ = local_290.type;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_290 = TVar12;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"EGL_GREEN_SIZE = ",0x11);
  std::ostream::operator<<(poVar3,local_278.greenBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  TVar12 = local_290;
  local_290.order = TVar11.order;
  local_290.type = TVar11.type;
  local_1b0._0_4_ = local_290.order;
  local_1b0._4_4_ = local_290.type;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_290 = TVar12;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"EGL_BLUE_SIZE = ",0x10);
  std::ostream::operator<<(poVar3,local_278.blueBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  TVar12 = local_290;
  local_290.order = TVar11.order;
  local_290.type = TVar11.type;
  local_1b0._0_4_ = local_290.order;
  local_1b0._4_4_ = local_290.type;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_290 = TVar12;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"EGL_ALPHA_SIZE = ",0x11);
  std::ostream::operator<<(poVar3,local_278.alphaBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  TVar12 = local_290;
  local_290.order = TVar11.order;
  local_290.type = TVar11.type;
  local_1b0._0_4_ = local_290.order;
  local_1b0._4_4_ = local_290.type;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_290 = TVar12;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"EGL_DEPTH_SIZE = ",0x11);
  std::ostream::operator<<(poVar3,depthBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  TVar12 = local_290;
  local_290.order = TVar11.order;
  local_290.type = TVar11.type;
  local_1b0._0_4_ = local_290.order;
  local_1b0._4_4_ = local_290.type;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_290 = TVar12;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"EGL_STENCIL_SIZE = ",0x13);
  std::ostream::operator<<(poVar3,stencilBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  TVar12 = local_290;
  local_290.order = TVar11.order;
  local_290.type = TVar11.type;
  local_1b0._0_4_ = local_290.order;
  local_1b0._4_4_ = local_290.type;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_290 = TVar12;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"EGL_SAMPLES = ",0xe);
  std::ostream::operator<<(poVar3,EVar18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  pSVar30 = local_268.
            super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_268.
      super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_268.
      super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = (Semaphore *)operator_new(8);
      de::Semaphore::Semaphore(this_00,0,0);
      pSVar21 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar21->strongRefCount = 0;
      pSVar21->weakRefCount = 0;
      pSVar21->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02166bc0;
      pSVar21[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
      pSVar21->strongRefCount = 1;
      pSVar21->weakRefCount = 1;
      pSVar5 = pSVar30->m_state;
      if (pSVar5 != pSVar21) {
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSVar5->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            pSVar30->m_ptr = (Semaphore *)0x0;
            (*pSVar30->m_state->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &pSVar30->m_state->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (pSVar30->m_state != (SharedPtrStateBase *)0x0) {
              (*pSVar30->m_state->_vptr_SharedPtrStateBase[1])();
            }
            pSVar30->m_state = (SharedPtrStateBase *)0x0;
          }
        }
        pSVar30->m_ptr = this_00;
        pSVar30->m_state = pSVar21;
        LOCK();
        pSVar21->strongRefCount = pSVar21->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &pSVar30->m_state->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      LOCK();
      pdVar1 = &pSVar21->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar21->_vptr_SharedPtrStateBase[2])(pSVar21);
      }
      LOCK();
      pdVar1 = &pSVar21->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar21->_vptr_SharedPtrStateBase[1])(pSVar21);
      }
      pSVar30 = pSVar30 + 1;
    } while (pSVar30 !=
             local_268.
             super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pDVar20 = local_2a8.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2a8.
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2a8.
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    drawOp = local_2a8.
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      anon_unknown_4::randomizeDrawOp((Random *)&local_1c0,drawOp);
      drawOp = drawOp + 1;
    } while (drawOp != pDVar20);
  }
  if (0 < (int)uVar27) {
    local_238 = (ulong)(uVar27 & 0x7fffffff);
    uVar29 = 0;
    iVar24 = 1;
    uVar28 = 0;
    do {
      std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>::resize
                (local_210.
                 super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar28,2);
      lVar25 = 0;
      local_27c = iVar24;
      local_230 = uVar29;
      do {
        pSVar30 = local_268.
                  super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pDVar6 = local_210.
                 super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar28].
                 super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar5 = *(SharedPtrStateBase **)((long)&(pDVar6->wait).m_state + lVar25);
        if (pSVar5 != local_268.
                      super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar24 + -1].m_state) {
          if (pSVar5 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSVar5->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              *(undefined8 *)((long)&(pDVar6->wait).m_ptr + lVar25) = 0;
              (**(code **)(**(long **)((long)&(pDVar6->wait).m_state + lVar25) + 0x10))();
            }
            LOCK();
            piVar2 = (int *)(*(long *)((long)&(pDVar6->wait).m_state + lVar25) + 0xc);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              plVar7 = *(long **)((long)&(pDVar6->wait).m_state + lVar25);
              if (plVar7 != (long *)0x0) {
                (**(code **)(*plVar7 + 8))();
              }
              *(undefined8 *)((long)&(pDVar6->wait).m_state + lVar25) = 0;
            }
          }
          *(Semaphore **)((long)&(pDVar6->wait).m_ptr + lVar25) = pSVar30[iVar24 + -1].m_ptr;
          pSVar5 = pSVar30[iVar24 + -1].m_state;
          *(SharedPtrStateBase **)((long)&(pDVar6->wait).m_state + lVar25) = pSVar5;
          if (pSVar5 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
            UNLOCK();
            LOCK();
            piVar2 = (int *)(*(long *)((long)&(pDVar6->wait).m_state + lVar25) + 0xc);
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
        }
        pSVar30 = local_268.
                  super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar5 = *(SharedPtrStateBase **)((long)&(pDVar6->signal).m_state + lVar25);
        if (pSVar5 != local_268.
                      super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar24].m_state) {
          if (pSVar5 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSVar5->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              *(undefined8 *)((long)&(pDVar6->signal).m_ptr + lVar25) = 0;
              (**(code **)(**(long **)((long)&(pDVar6->signal).m_state + lVar25) + 0x10))();
            }
            LOCK();
            piVar2 = (int *)(*(long *)((long)&(pDVar6->signal).m_state + lVar25) + 0xc);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              plVar7 = *(long **)((long)&(pDVar6->signal).m_state + lVar25);
              if (plVar7 != (long *)0x0) {
                (**(code **)(*plVar7 + 8))();
              }
              *(undefined8 *)((long)&(pDVar6->signal).m_state + lVar25) = 0;
            }
          }
          *(Semaphore **)((long)&(pDVar6->signal).m_ptr + lVar25) = pSVar30[iVar24].m_ptr;
          pSVar5 = pSVar30[iVar24].m_state;
          *(SharedPtrStateBase **)((long)&(pDVar6->signal).m_state + lVar25) = pSVar5;
          if (pSVar5 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
            UNLOCK();
            LOCK();
            piVar2 = (int *)(*(long *)((long)&(pDVar6->signal).m_state + lVar25) + 0xc);
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
        }
        *(undefined4 *)((long)&pDVar6->numOps + lVar25) = 2;
        *(pointer *)((long)&pDVar6->drawOps + lVar25) =
             local_2a8.
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
             ._M_impl.super__Vector_impl_data._M_start + (int)uVar29;
        lVar25 = lVar25 + 0x30;
        uVar29 = (ulong)(uint)((int)uVar29 + (int)local_288);
        iVar24 = iVar24 + uVar27;
      } while (lVar25 == 0x30);
      uVar28 = uVar28 + 1;
      uVar29 = (ulong)((int)local_230 + 2);
      iVar24 = local_27c + 1;
    } while (uVar28 != local_238);
  }
  if (0 < (int)uVar27) {
    uVar28 = (ulong)(uVar27 & 0x7fffffff);
    lVar25 = 0;
    do {
      ppVar8 = (contexts->
               super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      EVar17 = *(EGLint *)((long)&ppVar8->first + lVar25);
      (*egl->_vptr_Library[0x27])
                (egl,display,surface,surface,*(undefined8 *)((long)&ppVar8->second + lVar25));
      dVar19 = (*egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar19,"makeCurrent(display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x3c6);
      pPVar22 = anon_unknown_4::createProgram(&this->m_gl,EVar17);
      plVar23 = (long *)operator_new(0x20);
      pSVar15 = local_1f8.
                super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar23 + 1) = 0;
      *(undefined4 *)((long)plVar23 + 0xc) = 0;
      *plVar23 = (long)&PTR__SharedPtrState_02166af0;
      plVar23[2] = (long)pPVar22;
      *(undefined4 *)(plVar23 + 1) = 1;
      *(undefined4 *)((long)plVar23 + 0xc) = 1;
      plVar7 = *(long **)((long)&(local_1f8.
                                  super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar25);
      if (plVar7 != plVar23) {
        if (plVar7 != (long *)0x0) {
          LOCK();
          plVar7 = plVar7 + 1;
          *(int *)plVar7 = (int)*plVar7 + -1;
          UNLOCK();
          if ((int)*plVar7 == 0) {
            *(undefined8 *)
             ((long)&(local_1f8.
                      super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar25) = 0;
            (**(code **)(**(long **)((long)&(local_1f8.
                                             super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                    lVar25) + 0x10))();
          }
          LOCK();
          piVar2 = (int *)(*(long *)((long)&pSVar15->m_state + lVar25) + 0xc);
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            plVar7 = *(long **)((long)&pSVar15->m_state + lVar25);
            if (plVar7 != (long *)0x0) {
              (**(code **)(*plVar7 + 8))();
            }
            *(undefined8 *)((long)&pSVar15->m_state + lVar25) = 0;
          }
        }
        *(Program **)((long)&pSVar15->m_ptr + lVar25) = pPVar22;
        *(long **)((long)&pSVar15->m_state + lVar25) = plVar23;
        LOCK();
        *(int *)(plVar23 + 1) = (int)plVar23[1] + 1;
        UNLOCK();
        LOCK();
        piVar2 = (int *)(*(long *)((long)&pSVar15->m_state + lVar25) + 0xc);
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      LOCK();
      plVar7 = plVar23 + 1;
      *(int *)plVar7 = (int)*plVar7 + -1;
      UNLOCK();
      if ((int)*plVar7 == 0) {
        (**(code **)(*plVar23 + 0x10))(plVar23);
      }
      LOCK();
      piVar2 = (int *)((long)plVar23 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        (**(code **)(*plVar23 + 8))(plVar23);
      }
      (**(code **)(**(long **)((long)&(local_1f8.
                                       super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar25) +
                  0x10))();
      (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
      dVar19 = (*egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar19,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x3cc);
      lVar25 = lVar25 + 0x10;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  ppVar8 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar17 = ppVar8->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar8->second);
  dVar19 = (*egl->_vptr_Library[0x1f])();
  iVar24 = 0x3d4;
  eglu::checkError(dVar19,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3d4);
  gl = &this->m_gl;
  anon_unknown_4::clear(gl,EVar17,color,depth,iVar24);
  anon_unknown_4::finish(gl,EVar17);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  dVar19 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar19,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3da);
  if (0 < (int)uVar27) {
    uVar28 = (ulong)(uVar27 & 0x7fffffff);
    local_2e0 = 0;
    lVar25 = 0;
    do {
      local_288 = uVar28;
      this_01 = (Thread *)operator_new(0x58);
      pvVar14 = local_210.
                super__Vector_base<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar8 = (contexts->
               super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pp_Var9 = *(_func_int ***)((long)&ppVar8->second + lVar25);
      dVar4 = *(deThreadPriority *)((long)&ppVar8->first + lVar25);
      pp_Var10 = *(_func_int ***)
                  ((long)&(local_1f8.
                           super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar25);
      de::Thread::Thread(this_01);
      this_01->_vptr_Thread = (_func_int **)&PTR__Thread_02166b80;
      this_01[1]._vptr_Thread = (_func_int **)egl;
      *(EGLDisplay *)&this_01[1].m_attribs = display;
      this_01[1].m_thread = (deThread)surface;
      this_01[2]._vptr_Thread = pp_Var9;
      this_01[2].m_attribs.priority = dVar4;
      this_01[2].m_thread = (deThread)gl;
      this_01[3]._vptr_Thread = pp_Var10;
      *(long *)&this_01[3].m_attribs =
           (long)&(pvVar14->
                  super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_2e0;
      plVar23 = (long *)operator_new(0x20);
      pSVar13 = local_228.
                super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar23 + 1) = 0;
      *(undefined4 *)((long)plVar23 + 0xc) = 0;
      *plVar23 = (long)&PTR__SharedPtrState_02166c00;
      plVar23[2] = (long)this_01;
      *(undefined4 *)(plVar23 + 1) = 1;
      *(undefined4 *)((long)plVar23 + 0xc) = 1;
      plVar7 = *(long **)((long)&(local_228.
                                  super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar25);
      if (plVar7 != plVar23) {
        if (plVar7 != (long *)0x0) {
          LOCK();
          plVar7 = plVar7 + 1;
          *(int *)plVar7 = (int)*plVar7 + -1;
          UNLOCK();
          if ((int)*plVar7 == 0) {
            *(undefined8 *)
             ((long)&(local_228.
                      super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar25) = 0;
            (**(code **)(**(long **)((long)&(local_228.
                                             super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                    lVar25) + 0x10))();
          }
          LOCK();
          piVar2 = (int *)(*(long *)((long)&pSVar13->m_state + lVar25) + 0xc);
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            plVar7 = *(long **)((long)&pSVar13->m_state + lVar25);
            if (plVar7 != (long *)0x0) {
              (**(code **)(*plVar7 + 8))();
            }
            *(undefined8 *)((long)&pSVar13->m_state + lVar25) = 0;
          }
        }
        *(Thread **)((long)&pSVar13->m_ptr + lVar25) = this_01;
        *(long **)((long)&pSVar13->m_state + lVar25) = plVar23;
        LOCK();
        *(int *)(plVar23 + 1) = (int)plVar23[1] + 1;
        UNLOCK();
        LOCK();
        piVar2 = (int *)(*(long *)((long)&pSVar13->m_state + lVar25) + 0xc);
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      LOCK();
      plVar7 = plVar23 + 1;
      *(int *)plVar7 = (int)*plVar7 + -1;
      UNLOCK();
      if ((int)*plVar7 == 0) {
        (**(code **)(*plVar23 + 0x10))(plVar23);
      }
      uVar28 = local_288;
      LOCK();
      piVar2 = (int *)((long)plVar23 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        (**(code **)(*plVar23 + 8))(plVar23);
      }
      de::Thread::start(*(Thread **)
                         ((long)&(local_228.
                                  super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar25));
      lVar25 = lVar25 + 0x10;
      local_2e0 = local_2e0 + 0x18;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  deSemaphore_increment
            ((local_268.
              super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_ptr->m_semaphore);
  deSemaphore_decrement
            ((local_268.
              super__Vector_base<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->m_semaphore);
  ppVar8 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar17 = ppVar8->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar8->second);
  dVar19 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar19,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3ed);
  anon_unknown_4::readPixels(gl,EVar17,&local_1d8);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  dVar19 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar19,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x3f2);
  if (0 < (int)uVar27) {
    local_2f0 = (ulong)(uVar27 & 0x7fffffff);
    lVar25 = 0;
    do {
      de::Thread::join(*(Thread **)
                        ((long)&(local_228.
                                 super__Vector_base<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar25));
      lVar25 = lVar25 + 0x10;
      local_2f0 = local_2f0 - 1;
    } while (local_2f0 != 0);
  }
  local_1e0.order = RGBA;
  local_1e0.type = UNORM_INT8;
  data = (void *)local_250.m_pixels.m_cap;
  if ((void *)local_250.m_pixels.m_cap != (void *)0x0) {
    data = local_250.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1e0,local_250.m_width,local_250.m_height,1,data);
  anon_unknown_4::renderReference
            ((PixelBufferAccess *)local_1b0,&local_2a8,&local_278,depthBits,stencilBits,(int)data);
  bVar16 = tcu::fuzzyCompare((TestLog *)local_290,"ComparisonResult","Image comparison result",
                             &local_250,&local_1d8,0.02,COMPARE_LOG_RESULT);
  if (!bVar16) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::
  vector<de::SharedPtr<deqp::egl::RenderTestThread>,_std::allocator<de::SharedPtr<deqp::egl::RenderTestThread>_>_>
  ::~vector(&local_228);
  std::
  vector<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>,_std::allocator<std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>_>
  ::~vector(&local_210);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::~vector(&local_2a8);
  std::vector<de::SharedPtr<de::Semaphore>,_std::allocator<de::SharedPtr<de::Semaphore>_>_>::~vector
            (&local_268);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::~vector(&local_1f8);
  tcu::Surface::~Surface(&local_1d8);
  tcu::Surface::~Surface(&local_250);
  return;
}

Assistant:

void MultiThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl					= m_eglTestCtx.getLibrary();
	const int				width				= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height				= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts			= (int)contexts.size();
	const int				opsPerPacket		= 2;
	const int				packetsPerThread	= 2;
	const int				numThreads			= numContexts;
	const int				numPackets			= numThreads * packetsPerThread;
	const float				threshold			= 0.02f;

	const tcu::PixelFormat	pixelFmt			= getPixelFormat(egl, display, config.config);
	const int				depthBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits			= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples			= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log					= m_testCtx.getLog();

	tcu::Surface			refFrame			(width, height);
	tcu::Surface			frame				(width, height);

	de::Random				rnd					(deStringHash(getName()) ^ deInt32Hash(numContexts));

	// Resources that need cleanup
	vector<ProgramSp>				programs	(numContexts);
	vector<SemaphoreSp>				semaphores	(numPackets+1);
	vector<DrawPrimitiveOp>			drawOps		(numPackets*opsPerPacket);
	vector<vector<DrawOpPacket> >	packets		(numThreads);
	vector<RenderTestThreadSp>		threads		(numThreads);

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Initialize semaphores.
	for (vector<SemaphoreSp>::iterator sem = semaphores.begin(); sem != semaphores.end(); ++sem)
		*sem = SemaphoreSp(new de::Semaphore(0));

	// Create draw ops.
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create packets.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		packets[threadNdx].resize(packetsPerThread);

		for (int packetNdx = 0; packetNdx < packetsPerThread; packetNdx++)
		{
			DrawOpPacket& packet = packets[threadNdx][packetNdx];

			// Threads take turns with packets.
			packet.wait		= semaphores[packetNdx*numThreads + threadNdx];
			packet.signal	= semaphores[packetNdx*numThreads + threadNdx + 1];
			packet.numOps	= opsPerPacket;
			packet.drawOps	= &drawOps[(packetNdx*numThreads + threadNdx)*opsPerPacket];
		}
	}

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);

		// Release context
		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}

	// Create and launch threads (actual rendering starts once first semaphore is signaled).
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
	{
		threads[threadNdx] = RenderTestThreadSp(new RenderTestThread(egl, display, surface, contexts[threadNdx].second, contexts[threadNdx].first, m_gl, *programs[threadNdx], packets[threadNdx]));
		threads[threadNdx]->start();
	}

	// Signal start and wait until complete.
	semaphores.front()->increment();
	semaphores.back()->decrement();

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Join threads.
	for (int threadNdx = 0; threadNdx < numThreads; threadNdx++)
		threads[threadNdx]->join();

	// Render reference.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}